

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QByteArray,QPalette>::emplace<QPalette_const&>
          (QHash<QByteArray,QPalette> *this,QByteArray *key,QPalette *args)

{
  Data<QHashPrivate::Node<QByteArray,_QPalette>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QPalette local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QByteArray,_QPalette>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QByteArray,_QPalette>_> *)0x0) {
    local_38.d = (QPalettePrivate *)0x0;
LAB_002c3dad:
    pDVar1 = (Data<QHashPrivate::Node<QByteArray,_QPalette>_> *)0x0;
LAB_002c3dce:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QPalette>_>::detached(pDVar1);
    *(Data<QHashPrivate::Node<QByteArray,_QPalette>_> **)this = pDVar1;
LAB_002c3dd6:
    pVar2 = (piter)emplace_helper<QPalette_const&>(this,key,args);
    QHash<QByteArray,_QPalette>::~QHash((QHash<QByteArray,_QPalette> *)&local_38);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_38.d = (QPalettePrivate *)pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<QByteArray,_QPalette>_> **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<QByteArray,_QPalette>_> *)0x0) goto LAB_002c3dad;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_002c3dce;
      goto LAB_002c3dd6;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar2 = (piter)emplace_helper<QPalette_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_002c3e40;
    }
    QPalette::QPalette(&local_38,args);
    pVar2 = (piter)QHash<QByteArray,_QPalette>::emplace_helper<QPalette>
                             ((QHash<QByteArray,_QPalette> *)this,key,&local_38);
    QPalette::~QPalette(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar2;
  }
LAB_002c3e40:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }